

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

__pid_t __thiscall kj::Promise<siginfo_t>::wait(Promise<siginfo_t> *this,void *__stat_loc)

{
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *exception;
  long lVar1;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  undefined8 *puVar2;
  PromiseBase *pPVar3;
  byte bVar4;
  ExceptionOr<siginfo_t> result;
  ExceptionOrValue local_200;
  char local_a0;
  undefined8 local_98 [16];
  
  bVar4 = 0;
  local_200.exception.ptr.isSet = false;
  local_a0 = '\0';
  _::waitImpl((Own<kj::_::PromiseNode> *)__stat_loc,&local_200,
              (WaitScope *)CONCAT71(in_register_00000011,in_DL));
  puVar2 = (undefined8 *)0x0;
  if (local_a0 != '\0') {
    puVar2 = local_98;
  }
  if (local_a0 == '\x01') {
    exception = &local_200.exception.ptr.field_1;
    if (local_200.exception.ptr.isSet != false) {
      throwRecoverableException(&exception->value,0);
    }
    lVar1 = 0x10;
    pPVar3 = &this->super_PromiseBase;
    for (; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)pPVar3 = *puVar2;
      puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
      pPVar3 = (PromiseBase *)((long)pPVar3 + ((ulong)bVar4 * 0xfffffffffffffffe + 1) * 8);
    }
    if (local_200.exception.ptr.isSet == true) {
      Exception::~Exception(&exception->value);
    }
    return (__pid_t)this;
  }
  if (local_200.exception.ptr.isSet != false) {
    throwFatalException(&local_200.exception.ptr.field_1.value,0);
  }
  _::unreachable();
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope) {
  _::ExceptionOr<_::FixVoid<T>> result;

  _::waitImpl(kj::mv(node), result, waitScope);

  KJ_IF_MAYBE(value, result.value) {
    KJ_IF_MAYBE(exception, result.exception) {
      throwRecoverableException(kj::mv(*exception));
    }
    return _::returnMaybeVoid(kj::mv(*value));
  } else KJ_IF_MAYBE(exception, result.exception) {
    throwFatalException(kj::mv(*exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }